

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O0

Vec_Int_t * Lms_GiaCollectUsefulCos(Lms_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  int *piVar4;
  int local_3c;
  int SumTotal;
  int *pPlace;
  int Entry;
  int i;
  Vec_Int_t *vCounts;
  Vec_Int_t *vUseful;
  Vec_Int_t *vBegins;
  Lms_Man_t *p_local;
  
  iVar1 = Vec_MemEntryNum(p->vTtMem);
  p_00 = Vec_IntAlloc(iVar1);
  iVar1 = Gia_ManCoNum(p->pGia);
  iVar2 = Vec_MemEntryNum(p->vTtMem);
  p_01 = Vec_IntStartFull(iVar1 + iVar2);
  p_02 = Lms_GiaCountTruths(p);
  local_3c = 0;
  for (pPlace._4_4_ = 0; iVar1 = Vec_IntSize(p_02), pPlace._4_4_ < iVar1;
      pPlace._4_4_ = pPlace._4_4_ + 1) {
    iVar1 = Vec_IntEntry(p_02,pPlace._4_4_);
    if (iVar1 < 1) {
      __assert_fail("Entry > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRec3.c"
                    ,0x4ba,"Vec_Int_t *Lms_GiaCollectUsefulCos(Lms_Man_t *)");
    }
    Vec_IntPush(p_00,local_3c);
    local_3c = iVar1 + 1 + local_3c;
  }
  Vec_IntPush(p_00,local_3c);
  iVar1 = Vec_IntSize(p_02);
  Vec_IntFill(p_02,iVar1,0);
  pPlace._4_4_ = 0;
  do {
    iVar1 = Vec_IntSize(p->vTruthIds);
    if (iVar1 <= pPlace._4_4_) {
      Vec_IntFree(p_00);
      Vec_IntFree(p_02);
      return p_01;
    }
    iVar1 = Vec_IntEntry(p->vTruthIds,pPlace._4_4_);
    if (-1 < iVar1) {
      iVar2 = Vec_IntEntry(p_00,iVar1);
      iVar3 = Vec_IntEntry(p_02,iVar1);
      piVar4 = Vec_IntEntryP(p_01,iVar2 + iVar3);
      if (*piVar4 != -1) {
        __assert_fail("*pPlace == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRec3.c"
                      ,0x4c7,"Vec_Int_t *Lms_GiaCollectUsefulCos(Lms_Man_t *)");
      }
      *piVar4 = pPlace._4_4_;
      Vec_IntAddToEntry(p_02,iVar1,1);
    }
    pPlace._4_4_ = pPlace._4_4_ + 1;
  } while( true );
}

Assistant:

Vec_Int_t * Lms_GiaCollectUsefulCos( Lms_Man_t * p )
{
    Vec_Int_t * vBegins = Vec_IntAlloc( Vec_MemEntryNum(p->vTtMem) );
    Vec_Int_t * vUseful = Vec_IntStartFull( Gia_ManCoNum(p->pGia) + Vec_MemEntryNum(p->vTtMem) );
    Vec_Int_t * vCounts = Lms_GiaCountTruths( p );
    int i, Entry, * pPlace, SumTotal = 0;
    // mark up the place for POs
    Vec_IntForEachEntry( vCounts, Entry, i )
    {
        assert( Entry > 0 );
        Vec_IntPush( vBegins, SumTotal );
        SumTotal += Entry + 1;
//        printf( "%d ", Entry );
    }
    Vec_IntPush( vBegins, SumTotal );
    // fill out POs in their places
    Vec_IntFill( vCounts, Vec_IntSize(vCounts), 0 );
    Vec_IntForEachEntry( p->vTruthIds, Entry, i )
    {
        if ( Entry < 0 )
            continue;
        pPlace = Vec_IntEntryP( vUseful, Vec_IntEntry(vBegins, Entry) + Vec_IntEntry(vCounts, Entry) );
        assert( *pPlace == -1 );
        *pPlace = i;
        Vec_IntAddToEntry( vCounts, Entry, 1 );
    }
    Vec_IntFree( vBegins );
    Vec_IntFree( vCounts );
    return vUseful;
}